

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O0

void __thiscall
llvm::dwarf::CFIProgram::dump
          (CFIProgram *this,raw_ostream *OS,MCRegisterInfo *MRI,bool IsEH,uint IndentLevel)

{
  bool bVar1;
  reference Instr_00;
  raw_ostream *this_00;
  size_t sVar2;
  const_reference puVar3;
  StringRef Str;
  uint local_64;
  uint i;
  byte local_49;
  uint8_t Opcode;
  Instruction *Instr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
  *__range1;
  uint IndentLevel_local;
  bool IsEH_local;
  MCRegisterInfo *MRI_local;
  raw_ostream *OS_local;
  CFIProgram *this_local;
  
  __end1 = std::
           vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
           ::begin(&this->Instructions);
  Instr = (Instruction *)
          std::
          vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
          ::end(&this->Instructions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_llvm::dwarf::CFIProgram::Instruction_*,_std::vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>_>
                                *)&Instr);
    if (!bVar1) break;
    Instr_00 = __gnu_cxx::
               __normal_iterator<const_llvm::dwarf::CFIProgram::Instruction_*,_std::vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>_>
               ::operator*(&__end1);
    local_49 = Instr_00->Opcode;
    if ((local_49 & 0xc0) != 0) {
      local_49 = local_49 & 0xc0;
    }
    raw_ostream::indent(OS,IndentLevel << 1);
    Str = CallFrameString((uint)local_49,this->Arch);
    this_00 = raw_ostream::operator<<(OS,Str);
    raw_ostream::operator<<(this_00,":");
    local_64 = 0;
    while( true ) {
      sVar2 = SmallVectorBase::size((SmallVectorBase *)&Instr_00->Ops);
      if (sVar2 <= local_64) break;
      puVar3 = SmallVectorTemplateCommon<unsigned_long,_void>::operator[]
                         ((SmallVectorTemplateCommon<unsigned_long,_void> *)&Instr_00->Ops,
                          (ulong)local_64);
      printOperand(this,OS,MRI,IsEH,Instr_00,local_64,*puVar3);
      local_64 = local_64 + 1;
    }
    raw_ostream::operator<<(OS,'\n');
    __gnu_cxx::
    __normal_iterator<const_llvm::dwarf::CFIProgram::Instruction_*,_std::vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void CFIProgram::dump(raw_ostream &OS, const MCRegisterInfo *MRI, bool IsEH,
                      unsigned IndentLevel) const {
  for (const auto &Instr : Instructions) {
    uint8_t Opcode = Instr.Opcode;
    if (Opcode & DWARF_CFI_PRIMARY_OPCODE_MASK)
      Opcode &= DWARF_CFI_PRIMARY_OPCODE_MASK;
    OS.indent(2 * IndentLevel);
    OS << CallFrameString(Opcode, Arch) << ":";
    for (unsigned i = 0; i < Instr.Ops.size(); ++i)
      printOperand(OS, MRI, IsEH, Instr, i, Instr.Ops[i]);
    OS << '\n';
  }
}